

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O0

int archive_write_cpio_free(archive_write *a)

{
  void *__ptr;
  long in_RDI;
  cpio_conflict1 *cpio;
  
  __ptr = *(void **)(in_RDI + 0xd0);
  free(*(void **)((long)__ptr + 0x10));
  free(__ptr);
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  return 0;
}

Assistant:

static int
archive_write_cpio_free(struct archive_write *a)
{
	struct cpio *cpio;

	cpio = (struct cpio *)a->format_data;
	free(cpio->ino_list);
	free(cpio);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}